

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O2

void __thiscall GraphEdit::calculateAxis(GraphEdit *this)

{
  int iVar1;
  long lVar2;
  QFontMetrics metrics;
  QWidget aQStack_18 [8];
  
  QWidget::fontMetrics(aQStack_18);
  iVar1 = QFontMetrics::averageCharWidth();
  this->mYAxisWidth = iVar1 * 4;
  (this->mPlotRect).x1 = iVar1 * 4 + 0x10;
  lVar2 = QAbstractScrollArea::viewport();
  (this->mPlotRect).x2 =
       (*(int *)(*(long *)(lVar2 + 0x20) + 0x1c) - *(int *)(*(long *)(lVar2 + 0x20) + 0x14)) + -7;
  calculateCellWidth(this);
  QFontMetrics::~QFontMetrics((QFontMetrics *)aQStack_18);
  return;
}

Assistant:

void GraphEdit::calculateAxis() {

    // PADDING + mYAxisWidth + PADDING + mPlotRect.width() + PADDING = viewport()->width()
    auto metrics = fontMetrics();
    mYAxisWidth = metrics.averageCharWidth() * 4;
    mPlotRect.setLeft(mYAxisWidth + (TU::PADDING_X * 2));
    mPlotRect.setRight(viewport()->width() - TU::PADDING_X);
    calculateCellWidth();
}